

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateDisconnect(HelicsFederate fed,HelicsError *err)

{
  Federate *pFVar1;
  HelicsFederate in_RSI;
  Federate *fedObj;
  Federate *in_stack_000000f0;
  HelicsError *in_stack_ffffffffffffffe8;
  
  pFVar1 = getFed(in_RSI,in_stack_ffffffffffffffe8);
  if (pFVar1 != (Federate *)0x0) {
    helics::Federate::finalize(in_stack_000000f0);
  }
  return;
}

Assistant:

void helicsFederateDisconnect(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->finalize();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}